

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolve
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  Node *this_00;
  StringPtr name_00;
  long lVar1;
  bool bVar2;
  ulong uVar3;
  StringPtr name_01;
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  _member868;
  Reader params;
  ArrayPtr<const_char> local_138;
  Node *local_128;
  ArrayPtr<const_char> local_120;
  undefined1 local_110 [112];
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_a0;
  
  local_138.size_ = name.content.size_;
  local_138.ptr = name.content.ptr;
  resolveMember((Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                 *)&local_a0,this,name);
  kj::_::
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                   *)local_110,&local_a0);
  if (local_110[0] == true) {
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::NullableValue(&__return_storage_ptr__->ptr,
                    (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                     *)(local_110 + 8));
  }
  else {
    local_128 = this;
    Declaration::Reader::getParameters((Reader *)&local_a0,&this->declaration);
    uVar3 = 0;
    do {
      if ((uint)local_a0.field_1._16_4_ == uVar3) {
        this_00 = (local_128->parent).ptr;
        if (this_00 != (Node *)0x0) {
          name_00.content.size_ = local_138.size_;
          name_00.content.ptr = local_138.ptr;
          resolve(__return_storage_ptr__,this_00,name_00);
          return __return_storage_ptr__;
        }
        name_01.content.size_ = (size_t)local_138.ptr;
        name_01.content.ptr = (char *)local_128->module->compiler;
        Compiler::Impl::lookupBuiltin((Impl *)local_110,name_01);
        lVar1 = CONCAT44(local_110._4_4_,local_110._0_4_);
        if (lVar1 != 0) {
          local_110._8_8_ = *(undefined8 *)(lVar1 + 0x48);
          local_110._16_4_ = *(undefined4 *)(lVar1 + 100);
          local_110._32_2_ = *(undefined2 *)(lVar1 + 0x60);
          local_110._24_8_ = 0;
          local_110[0x30] = 0;
          local_110._0_4_ = 1;
          kj::_::
          NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
          ::NullableValue(&__return_storage_ptr__->ptr,
                          (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                           *)local_110);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->ptr).isSet = false;
        return __return_storage_ptr__;
      }
      capnp::_::ListReader::getStructElement
                ((StructReader *)local_110,(ListReader *)&local_a0,(ElementCount)uVar3);
      local_120 = (ArrayPtr<const_char>)
                  Declaration::BrandParameter::Reader::getName((Reader *)local_110);
      bVar2 = kj::ArrayPtr<const_char>::operator==(&local_120,&local_138);
      uVar3 = uVar3 + 1;
    } while (!bVar2);
    local_110._8_8_ = local_128->id;
    local_110._16_4_ = (int)uVar3 + -1;
    local_110._0_4_ = 2;
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::NullableValue(&__return_storage_ptr__->ptr,
                    (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                     *)local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult>
Compiler::Node::resolve(kj::StringPtr name) {
  // Check members.
  KJ_IF_SOME(member, resolveMember(name)) {
    return member;
  }

  // Check parameters.
  // TODO(perf): Maintain a map?
  auto params = declaration.getParameters();
  for (uint i: kj::indices(params)) {
    if (params[i].getName() == name) {
      ResolveResult result;
      result.init<ResolvedParameter>(ResolvedParameter {id, i});
      return result;
    }
  }

  // Check parent scope.
  KJ_IF_SOME(p, parent) {
    return p.resolve(name);
  } else KJ_IF_SOME(b, module->getCompiler().lookupBuiltin(name)) {
    ResolveResult result;
    result.init<ResolvedDecl>(ResolvedDecl { b.id, b.genericParamCount, 0, b.kind, &b, kj::none });
    return result;
  } else {
    return kj::none;
  }
}